

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_frame_corrupted(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  long lVar2;
  undefined8 *local_50;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  int *corrupted;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_50 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_50 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_50 + 1;
  }
  if ((int *)*local_50 == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    lVar2 = *ctx->frame_worker->data1;
    if ((*(int *)(lVar2 + 0x58db8) == 0) || (*(long *)(lVar2 + 0x58d78) != 0)) {
      if (ctx->last_show_frame != (RefCntBuffer *)0x0) {
        *(int *)*local_50 = (ctx->last_show_frame->buf).corrupted;
      }
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_ERROR;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_frame_corrupted(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  int *corrupted = va_arg(args, int *);

  if (corrupted) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      AV1Decoder *const pbi = frame_worker_data->pbi;
      if (pbi->seen_frame_header && pbi->num_output_frames == 0)
        return AOM_CODEC_ERROR;
      if (ctx->last_show_frame != NULL)
        *corrupted = ctx->last_show_frame->buf.corrupted;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}